

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

bool __thiscall HttpContext::processRequestLine(HttpContext *this,char *begin,char *end)

{
  Version VVar1;
  bool bVar2;
  char *pcVar3;
  char *__last;
  char *__last_00;
  string *this_00;
  
  pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(begin,end);
  if ((pcVar3 != end) && (bVar2 = HttpRequest::SetMethod(&this->_request,begin,pcVar3), bVar2)) {
    pcVar3 = pcVar3 + 1;
    __last = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(pcVar3,end);
    if (__last != end) {
      __last_00 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (pcVar3,__last);
      this_00 = (string *)&(this->_request)._path;
      if (__last_00 != __last) {
        std::__cxx11::string::assign<char_const*,void>(this_00,pcVar3,__last_00);
        this_00 = (string *)&(this->_request)._query;
        pcVar3 = __last_00;
      }
      std::__cxx11::string::assign<char_const*,void>(this_00,pcVar3,__last);
      bVar2 = std::__equal<true>::equal<char>(__last + 1,__last + 9,"HTTP/1.1");
      if (bVar2) {
        VVar1 = Http11;
      }
      else {
        bVar2 = std::__equal<true>::equal<char>(__last + 1,__last + 9,"HTTP/1.0");
        if (!bVar2) {
          return false;
        }
        VVar1 = Http10;
      }
      (this->_request)._version = VVar1;
      return true;
    }
  }
  return false;
}

Assistant:

bool HttpContext::processRequestLine(const char* begin, const char* end) {
    bool succeed = false;
    const char* start = begin;
    const char* space = std::find(start, end, ' ');
    if (space != end && _request.SetMethod(start, space)) {
        start = space + 1;
        space = std::find(start, end, ' ');
        if (space != end) {
            const char* question = std::find(start, space, '?');
            if (question != space) {
                _request.SetPath(start, question);
                _request.SetQuery(question, space);

            } else {
                _request.SetPath(start, space);
            }

            start = space + 1;
            const char* version_end = start + VERSION_LEN - 1;
            succeed = true;
            if (std::equal(start, version_end, "HTTP/1.1")) {
                _request.SetVersion(Http11);

            } else if (std::equal(start, version_end, "HTTP/1.0")) {
                _request.SetVersion(Http10);

            } else {
                succeed = false;
            }
        }
    }
    return succeed;
}